

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_crypto_two_reg_sha(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t regno;
  uint32_t regno_00;
  TCGv_ptr arg;
  TCGv_ptr arg_00;
  TCGv_ptr tcg_rn_ptr;
  TCGv_ptr tcg_rd_ptr;
  code *pcStack_38;
  _Bool feature;
  CryptoTwoOpFn *genfn;
  int rd;
  int rn;
  int opcode;
  int size;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = extract32(insn,0x16,2);
  uVar3 = extract32(insn,0xc,5);
  regno = extract32(insn,5,5);
  regno_00 = extract32(insn,0,5);
  if (uVar2 == 0) {
    if (uVar3 == 0) {
      tcg_rd_ptr._7_1_ = isar_feature_aa64_sha1(s->isar);
      pcStack_38 = gen_helper_crypto_sha1h;
    }
    else if (uVar3 == 1) {
      tcg_rd_ptr._7_1_ = isar_feature_aa64_sha1(s->isar);
      pcStack_38 = gen_helper_crypto_sha1su1;
    }
    else {
      if (uVar3 != 2) {
        unallocated_encoding_aarch64(s);
        return;
      }
      tcg_rd_ptr._7_1_ = isar_feature_aa64_sha256(s->isar);
      pcStack_38 = gen_helper_crypto_sha256su0;
    }
    if (tcg_rd_ptr._7_1_ == false) {
      unallocated_encoding_aarch64(s);
    }
    else {
      _Var1 = fp_access_check(s);
      if (_Var1) {
        arg = vec_full_reg_ptr(s,regno_00);
        arg_00 = vec_full_reg_ptr(s,regno);
        (*pcStack_38)(tcg_ctx_00,arg,arg_00);
        tcg_temp_free_ptr(tcg_ctx_00,arg);
        tcg_temp_free_ptr(tcg_ctx_00,arg_00);
      }
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_crypto_two_reg_sha(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    CryptoTwoOpFn *genfn;
    bool feature;
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;

    if (size != 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0: /* SHA1H */
        feature = dc_isar_feature(aa64_sha1, s);
        genfn = gen_helper_crypto_sha1h;
        break;
    case 1: /* SHA1SU1 */
        feature = dc_isar_feature(aa64_sha1, s);
        genfn = gen_helper_crypto_sha1su1;
        break;
    case 2: /* SHA256SU0 */
        feature = dc_isar_feature(aa64_sha256, s);
        genfn = gen_helper_crypto_sha256su0;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
}